

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O0

path * __thiscall CPath::remove_filename_abi_cxx11_(CPath *this)

{
  string_type *psVar1;
  undefined1 local_30 [8];
  string_type ns;
  CPath *this_local;
  
  ns.field_2._8_8_ = this;
  psVar1 = std::filesystem::__cxx11::path::native(&this->super_path);
  std::__cxx11::string::string((string *)local_30,(string *)psVar1);
  psVar1 = std::filesystem::__cxx11::path::native(&this->super_path);
  std::__cxx11::string::find_last_of((char)psVar1,0x2f);
  std::__cxx11::string::resize((ulong)local_30);
  std::filesystem::__cxx11::path::assign<std::__cxx11::string>
            (&this->super_path,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return &this->super_path;
}

Assistant:

path& remove_filename()
	{
		auto ns = native();

		ns.resize(native().find_last_of(preferred_separator) + 1);
		assign(ns);

		return *this;
	}